

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O0

void Fra_ClassesCopyReprs(Fra_Cla_t *p,Vec_Ptr_t *vFailed)

{
  Aig_Man_t *p_00;
  Aig_Obj_t **__dest;
  Aig_Obj_t **__src;
  int iVar1;
  void *pvVar2;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vFailed_local;
  Fra_Cla_t *p_local;
  
  p_00 = p->pAig;
  iVar1 = Aig_ManObjNumMax(p->pAig);
  Aig_ManReprStart(p_00,iVar1);
  __dest = p->pAig->pReprs;
  __src = p->pMemRepr;
  iVar1 = Aig_ManObjNumMax(p->pAig);
  memmove(__dest,__src,(long)iVar1 << 3);
  iVar1 = Vec_PtrSize(p->vClasses1);
  if ((iVar1 == 0) && (iVar1 = Vec_PtrSize(p->vClasses), iVar1 == 0)) {
    for (local_24 = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), local_24 < iVar1;
        local_24 = local_24 + 1) {
      pvVar2 = Vec_PtrEntry(p->pAig->vObjs,local_24);
      if (pvVar2 != (void *)0x0) {
        if (p->pAig->pReprs[local_24] != (Aig_Obj_t *)0x0) {
          printf("Classes are not cleared!\n");
        }
        if (p->pAig->pReprs[local_24] != (Aig_Obj_t *)0x0) {
          __assert_fail("p->pAig->pReprs[i] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClass.c"
                        ,0x7e,"void Fra_ClassesCopyReprs(Fra_Cla_t *, Vec_Ptr_t *)");
        }
      }
    }
  }
  if (vFailed != (Vec_Ptr_t *)0x0) {
    for (local_24 = 0; iVar1 = Vec_PtrSize(vFailed), local_24 < iVar1; local_24 = local_24 + 1) {
      pvVar2 = Vec_PtrEntry(vFailed,local_24);
      p->pAig->pReprs[*(int *)((long)pvVar2 + 0x24)] = (Aig_Obj_t *)0x0;
    }
  }
  return;
}

Assistant:

void Fra_ClassesCopyReprs( Fra_Cla_t * p, Vec_Ptr_t * vFailed )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManReprStart( p->pAig, Aig_ManObjNumMax(p->pAig) );
    memmove( p->pAig->pReprs, p->pMemRepr, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p->pAig) );
    if ( Vec_PtrSize(p->vClasses1) == 0 && Vec_PtrSize(p->vClasses) == 0 )
    {
        Aig_ManForEachObj( p->pAig, pObj, i )
        {
            if ( p->pAig->pReprs[i] != NULL )
                printf( "Classes are not cleared!\n" );
            assert( p->pAig->pReprs[i] == NULL );
        }
    }
    if ( vFailed )
        Vec_PtrForEachEntry( Aig_Obj_t *, vFailed, pObj, i )
            p->pAig->pReprs[pObj->Id] = NULL;
}